

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_ustar.c
# Opt level: O0

int format_number(int64_t v,char *p,int s,int maxsize,int strict)

{
  int iVar1;
  long local_38;
  int64_t limit;
  int strict_local;
  int maxsize_local;
  int s_local;
  char *p_local;
  int64_t v_local;
  
  local_38 = 1L << ((char)s * '\x03' & 0x3fU);
  if (strict == 0) {
    strict_local = s;
    if (-1 < v) {
      for (; strict_local <= maxsize; strict_local = strict_local + 1) {
        if (v < local_38) {
          iVar1 = format_octal(v,p,strict_local);
          return iVar1;
        }
        local_38 = local_38 << 3;
      }
    }
    v_local._4_4_ = format_256(v,p,maxsize);
  }
  else {
    v_local._4_4_ = format_octal(v,p,s);
  }
  return v_local._4_4_;
}

Assistant:

static int
format_number(int64_t v, char *p, int s, int maxsize, int strict)
{
	int64_t limit;

	limit = ((int64_t)1 << (s*3));

	/* "Strict" only permits octal values with proper termination. */
	if (strict)
		return (format_octal(v, p, s));

	/*
	 * In non-strict mode, we allow the number to overwrite one or
	 * more bytes of the field termination.  Even old tar
	 * implementations should be able to handle this with no
	 * problem.
	 */
	if (v >= 0) {
		while (s <= maxsize) {
			if (v < limit)
				return (format_octal(v, p, s));
			s++;
			limit <<= 3;
		}
	}

	/* Base-256 can handle any number, positive or negative. */
	return (format_256(v, p, maxsize));
}